

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

void __thiscall VCCluster::addItem(VCCluster *this,VCFace *f)

{
  iterator iVar1;
  VCFace *local_40;
  Vector3d *local_38;
  Vector3d *local_30;
  double local_28;
  
  local_40 = f;
  iVar1 = std::
          _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
          ::find(&(this->items)._M_t,&local_40);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->items)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>::
    _M_insert_unique<VCFace*const&>
              ((_Rb_tree<VCFace*,VCFace*,std::_Identity<VCFace*>,std::less<VCFace*>,std::allocator<VCFace*>>
                *)&this->items,&local_40);
    this->area = local_40->area + this->area;
    local_38 = &this->weightedSum;
    local_28 = local_40->area;
    local_30 = &local_40->center;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_38,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_38);
    local_40->cluster = this;
    Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)&this->E,
               (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_40->E);
    (**this->_vptr_VCCluster)(this,local_40);
  }
  return;
}

Assistant:

void VCCluster::addItem(VCFace* f) {
	if (items.find(f) == items.end()) {
		items.insert(f);
		area += f->area;
		weightedSum = weightedSum + f->center * f->area;
		f->cluster = this;
		E += f->E;
		addItemAdditionalAct(f);
	}
}